

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

int equal_email(uchar *a,size_t a_len,uchar *b,size_t b_len,uint unused_flags)

{
  uchar *puVar1;
  uchar *puVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  uchar *puVar7;
  size_t i;
  ulong uVar8;
  
  if (a_len != b_len) {
    return 0;
  }
  puVar1 = a + -1;
  puVar2 = b + -1;
  uVar3 = 0;
  do {
    uVar8 = uVar3;
    puVar7 = puVar2;
    puVar6 = puVar1;
    if (a_len == uVar8) goto LAB_001aa093;
    if (puVar6[a_len] == '@') break;
    puVar1 = puVar6 + -1;
    puVar2 = puVar7 + -1;
    uVar3 = uVar8 + 1;
  } while (puVar7[a_len] != '@');
  iVar4 = equal_nocase(puVar6 + a_len,uVar8 + 1,puVar7 + a_len,uVar8 + 1,unused_flags);
  if (iVar4 == 0) {
    uVar5 = 0;
  }
  else {
    if (a_len - 1 == uVar8) {
LAB_001aa093:
      if (a_len == 0) {
        return 1;
      }
    }
    else {
      a_len = a_len + ~uVar8;
    }
    iVar4 = bcmp(a,b,a_len);
    uVar5 = (uint)(iVar4 == 0);
  }
  return uVar5;
}

Assistant:

static int equal_email(const unsigned char *a, size_t a_len,
                       const unsigned char *b, size_t b_len,
                       unsigned int unused_flags) {
  size_t i = a_len;
  if (a_len != b_len) {
    return 0;
  }
  // We search backwards for the '@' character, so that we do not have to
  // deal with quoted local-parts.  The domain part is compared in a
  // case-insensitive manner.
  while (i > 0) {
    --i;
    if (a[i] == '@' || b[i] == '@') {
      if (!equal_nocase(a + i, a_len - i, b + i, a_len - i, 0)) {
        return 0;
      }
      break;
    }
  }
  if (i == 0) {
    i = a_len;
  }
  return equal_case(a, i, b, i, 0);
}